

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O1

void __thiscall
wasm::RemoveNonJSOpsPass::addNeededFunctions
          (RemoveNonJSOpsPass *this,Module *m,Name name,
          set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *needed)

{
  Call *pCVar1;
  Name name_00;
  Function *pFVar2;
  pointer ppCVar3;
  pair<std::_Rb_tree_iterator<wasm::Name>,_bool> pVar4;
  undefined1 local_60 [8];
  Name name_local;
  FindAll<wasm::Call> calls;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_60 = name.super_IString.str._M_len;
  pVar4 = std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_emplace_unique<wasm::Name&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)needed,(Name *)local_60);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)local_60;
    pFVar2 = Module::getFunction(m,name_00);
    FindAll<wasm::Call>::FindAll
              ((FindAll<wasm::Call> *)&name_local.super_IString.str._M_str,pFVar2->body);
    for (ppCVar3 = (pointer)name_local.super_IString.str._M_str;
        ppCVar3 !=
        calls.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
        super__Vector_impl_data._M_start; ppCVar3 = ppCVar3 + 1) {
      pCVar1 = *ppCVar3;
      pFVar2 = Module::getFunction(m,(Name)(pCVar1->target).super_IString.str);
      if ((pFVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        addNeededFunctions(this,m,(Name)(pCVar1->target).super_IString.str,needed);
      }
    }
    if (name_local.super_IString.str._M_str != (char *)0x0) {
      operator_delete(name_local.super_IString.str._M_str,
                      (long)calls.list.
                            super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)name_local.super_IString.str._M_str);
    }
  }
  return;
}

Assistant:

void addNeededFunctions(Module& m, Name name, std::set<Name>& needed) {
    if (!needed.emplace(name).second) {
      return;
    }

    auto function = m.getFunction(name);
    FindAll<Call> calls(function->body);
    for (auto* call : calls.list) {
      auto* called = m.getFunction(call->target);
      if (!called->imported()) {
        this->addNeededFunctions(m, call->target, needed);
      }
    }
  }